

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::AddStores(AggressiveDCEPass *this,Function *func,uint32_t ptrId)

{
  uint32_t id;
  DefUseManager *this_00;
  anon_class_24_3_d157440e local_58;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  uint32_t local_1c;
  Function *pFStack_18;
  uint32_t ptrId_local;
  Function *func_local;
  AggressiveDCEPass *this_local;
  
  local_1c = ptrId;
  pFStack_18 = func;
  func_local = (Function *)this;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  id = local_1c;
  local_58.ptrId = local_1c;
  local_58.func = pFStack_18;
  local_58.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::AggressiveDCEPass::AddStores(spvtools::opt::Function*,unsigned_int)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_40,&local_58);
  analysis::DefUseManager::ForEachUser(this_00,id,&local_40);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

void AggressiveDCEPass::AddStores(Function* func, uint32_t ptrId) {
  get_def_use_mgr()->ForEachUser(ptrId, [this, ptrId, func](Instruction* user) {
    // If the user is not a part of |func|, skip it.
    BasicBlock* blk = context()->get_instr_block(user);
    if (blk && blk->GetParent() != func) return;

    switch (user->opcode()) {
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpCopyObject:
        this->AddStores(func, user->result_id());
        break;
      case spv::Op::OpLoad:
        break;
      case spv::Op::OpCopyMemory:
      case spv::Op::OpCopyMemorySized:
        if (user->GetSingleWordInOperand(kCopyMemoryTargetAddrInIdx) == ptrId) {
          AddToWorklist(user);
        }
        break;
      // If default, assume it stores e.g. frexp, modf, function call
      case spv::Op::OpStore: {
        const uint32_t kStoreTargetAddrInIdx = 0;
        if (user->GetSingleWordInOperand(kStoreTargetAddrInIdx) == ptrId)
          AddToWorklist(user);
        break;
      }
      default:
        AddToWorklist(user);
        break;
    }
  });
}